

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O3

void __thiscall cmMakefile::AddTestGenerator(cmMakefile *this,cmTestGenerator *g)

{
  pointer *pppcVar1;
  iterator __position;
  cmTestGenerator *local_8;
  
  if (g != (cmTestGenerator *)0x0) {
    __position._M_current =
         (this->TestGenerators).
         super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = g;
      std::vector<cmTestGenerator*,std::allocator<cmTestGenerator*>>::
      _M_realloc_insert<cmTestGenerator*const&>
                ((vector<cmTestGenerator*,std::allocator<cmTestGenerator*>> *)&this->TestGenerators,
                 __position,&local_8);
    }
    else {
      *__position._M_current = g;
      pppcVar1 = &(this->TestGenerators).
                  super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void AddTestGenerator(cmTestGenerator* g)
  {
    if (g) {
      this->TestGenerators.push_back(g);
    }
  }